

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  uint *puVar1;
  undefined8 *puVar2;
  pointer pnVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  pointer pSVar10;
  DataKey DVar11;
  SPxId SVar12;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  uint local_a4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_e8.fpclass = cpp_dec_float_finite;
  local_e8.prec_elem = 10;
  local_e8.data._M_elems[0] = 0;
  local_e8.data._M_elems[1] = 0;
  local_e8.data._M_elems[2] = 0;
  local_e8.data._M_elems[3] = 0;
  local_e8.data._M_elems[4] = 0;
  local_e8.data._M_elems[5] = 0;
  local_e8.data._M_elems._24_5_ = 0;
  local_e8.data._M_elems[7]._1_3_ = 0;
  local_e8.data._M_elems._32_5_ = 0;
  local_e8.data._M_elems[9]._1_3_ = 0;
  local_e8.exp = 0;
  local_e8.neg = false;
  pSVar13 = (this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver;
  if (pSVar13->thePricing == PARTIAL) {
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 10;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems._24_5_ = 0;
    local_128.data._M_elems[7]._1_3_ = 0;
    local_128.data._M_elems._32_5_ = 0;
    local_128.data._M_elems[9]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    local_68.data._M_elems._32_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 8);
    local_68.data._M_elems._0_8_ =
         *(undefined8 *)
          (this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.data._M_elems;
    local_68.data._M_elems._8_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 2);
    local_68.data._M_elems._16_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 4);
    local_68.data._M_elems._24_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 6);
    local_68.exp = (this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thetolerance.m_backend.exp;
    local_68.neg = (this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thetolerance.m_backend.neg;
    local_68.fpclass =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.fpclass;
    local_68.prec_elem =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.prec_elem;
    if (local_68.fpclass != cpp_dec_float_finite || local_68.data._M_elems[0] != 0) {
      local_68.neg = (bool)(local_68.neg ^ 1);
    }
    local_a4 = this->last;
    uVar18 = (ulong)this->used;
    if (0 < (long)uVar18) {
      uVar20 = uVar18 + 1;
      lVar19 = uVar18 << 6;
      do {
        pSVar10 = (this->pricSet).data.
                  super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar16 = 0xe8;
        if (*(int *)((long)&pSVar10[-1].test.m_backend + lVar19 + -8) < 1) {
          lVar16 = 0x20;
        }
        iVar8 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                ::number((ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                          *)((long)&(((this->
                                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).thesolver)->
                                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray + lVar16),
                         (DataKey *)((long)&pSVar10[-1].test.m_backend + lVar19 + -8));
        pSVar13 = (this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver;
        pSVar10 = (this->pricSet).data.
                  super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pSVar13->theRep * *(int *)((long)&pSVar10[-1].test.m_backend + lVar19 + -8) < 1) {
          pnVar3 = (pSVar13->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar4 = *(undefined8 *)((long)&pnVar3[iVar8].m_backend.data + 0x20);
          local_128.data._M_elems._32_5_ = SUB85(uVar4,0);
          local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          local_128.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar8].m_backend.data;
          local_128.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar8].m_backend.data + 8);
          puVar1 = (uint *)((long)&pnVar3[iVar8].m_backend.data + 0x10);
          local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          uVar6 = *(undefined8 *)(puVar1 + 2);
          local_128.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_128.exp = pnVar3[iVar8].m_backend.exp;
          local_128.neg = pnVar3[iVar8].m_backend.neg;
          local_128.fpclass = pnVar3[iVar8].m_backend.fpclass;
          local_128.prec_elem = pnVar3[iVar8].m_backend.prec_elem;
          *(undefined8 *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x20) = uVar4;
          puVar1 = (uint *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x10);
          *(undefined8 *)puVar1 = local_128.data._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = uVar6;
          puVar1 = (uint *)((long)&pSVar10[-1].test.m_backend + lVar19);
          *(undefined8 *)puVar1 = local_128.data._M_elems._0_8_;
          *(undefined8 *)(puVar1 + 2) = local_128.data._M_elems._8_8_;
          *(int *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x28) = local_128.exp;
          *(bool *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x2c) = local_128.neg;
          *(undefined8 *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x30) = local_128._48_8_;
        }
        else {
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::computePvec(&local_a0,pSVar13,iVar8);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::computeTest(&local_a0,
                        (this->
                        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver,iVar8);
          local_128.data._M_elems._32_5_ = local_a0.m_backend.data._M_elems._32_5_;
          local_128.data._M_elems[9]._1_3_ = local_a0.m_backend.data._M_elems[9]._1_3_;
          local_128.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
          local_128.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
          local_128.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
          local_128.data._M_elems[7]._1_3_ = local_a0.m_backend.data._M_elems[7]._1_3_;
          local_128.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
          local_128.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
          local_128.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
          local_128.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
          local_128.exp = local_a0.m_backend.exp;
          local_128.neg = local_a0.m_backend.neg;
          local_128.fpclass = local_a0.m_backend.fpclass;
          local_128.prec_elem = local_a0.m_backend.prec_elem;
          pSVar10 = (this->pricSet).data.
                    super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x20) =
               local_a0.m_backend.data._M_elems._32_8_;
          puVar1 = (uint *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x10);
          *(undefined8 *)puVar1 = local_a0.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = local_a0.m_backend.data._M_elems._24_8_;
          puVar1 = (uint *)((long)&pSVar10[-1].test.m_backend + lVar19);
          *(undefined8 *)puVar1 = local_a0.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(puVar1 + 2) = local_a0.m_backend.data._M_elems._8_8_;
          *(int *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x28) = local_a0.m_backend.exp;
          *(bool *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x2c) = local_a0.m_backend.neg;
          *(undefined8 *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x30) =
               local_a0.m_backend._48_8_;
        }
        if (((local_128.fpclass != cpp_dec_float_NaN) && (local_68.fpclass != cpp_dec_float_NaN)) &&
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_128,&local_68), -1 < iVar8)) {
          lVar16 = (long)this->used + -1;
          this->used = (int)lVar16;
          pSVar10 = (this->pricSet).data.
                    super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(DataKey *)((long)&pSVar10[-1].test.m_backend + lVar19 + -8) =
               pSVar10[lVar16].id.super_DataKey;
          uVar4 = *(undefined8 *)((long)&pSVar10[lVar16].test.m_backend + 8);
          puVar1 = (uint *)((long)&pSVar10[lVar16].test.m_backend + 0x10);
          uVar6 = *(undefined8 *)puVar1;
          uVar7 = *(undefined8 *)(puVar1 + 2);
          puVar2 = (undefined8 *)((long)&pSVar10[-1].test.m_backend + lVar19);
          *puVar2 = *(undefined8 *)&pSVar10[lVar16].test.m_backend;
          puVar2[1] = uVar4;
          puVar2 = (undefined8 *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x10);
          *puVar2 = uVar6;
          puVar2[1] = uVar7;
          *(undefined8 *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x20) =
               *(undefined8 *)((long)&pSVar10[lVar16].test.m_backend + 0x20);
          *(int *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x28) =
               *(int *)((long)&pSVar10[lVar16].test.m_backend + 0x28);
          *(bool *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x2c) =
               *(bool *)((long)&pSVar10[lVar16].test.m_backend + 0x2c);
          *(undefined8 *)((long)&pSVar10[-1].test.m_backend + lVar19 + 0x30) =
               *(undefined8 *)((long)&pSVar10[lVar16].test.m_backend + 0x30);
        }
        uVar20 = uVar20 - 1;
        lVar19 = lVar19 + -0x40;
      } while (1 < uVar20);
      uVar18 = (ulong)(uint)this->used;
    }
    pSVar10 = (this->pricSet).data.
              super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = (long)(this->pricSet).data.
                   super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar10;
    while (iVar8 = (int)uVar18, (int)(uVar20 >> 6) - iVar8 < this->partialSize) {
      if (iVar8 < 2) {
        lVar19 = 0;
      }
      else {
        iVar17 = 0;
        lVar19 = 1;
        lVar16 = 0x48;
        do {
          pSVar10 = (this->pricSet).data.
                    super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((*(int *)((long)&(pSVar10->test).m_backend + lVar16 + 0x28U) != 2) &&
             (*(fpclass_type *)((long)&pSVar10[iVar17].test.m_backend + 0x30) != cpp_dec_float_NaN))
          {
            iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)
                               ((long)&(pSVar10->test).m_backend + lVar16 + -8),
                               &pSVar10[iVar17].test.m_backend);
            iVar8 = (int)lVar19;
            if (iVar9 < 1) {
              iVar8 = iVar17;
            }
            uVar18 = (ulong)(uint)this->used;
            iVar17 = iVar8;
          }
          lVar19 = lVar19 + 1;
          iVar8 = (int)uVar18;
          lVar16 = lVar16 + 0x40;
        } while (lVar19 < iVar8);
        pSVar10 = (this->pricSet).data.
                  super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar19 = (long)iVar17;
      }
      this->used = iVar8 + -1;
      pSVar10[lVar19].id.super_DataKey = pSVar10[(long)iVar8 + -1].id.super_DataKey;
      uVar4 = *(undefined8 *)((long)&pSVar10[(long)iVar8 + -1].test.m_backend + 8);
      uVar6 = *(undefined8 *)((long)&pSVar10[(long)iVar8 + -1].test.m_backend + 0x10);
      uVar7 = *(undefined8 *)((long)&pSVar10[(long)iVar8 + -1].test.m_backend + 0x18);
      *(undefined8 *)&pSVar10[lVar19].test.m_backend =
           *(undefined8 *)&pSVar10[(long)iVar8 + -1].test.m_backend;
      *(undefined8 *)((long)&pSVar10[lVar19].test.m_backend + 8) = uVar4;
      puVar1 = (uint *)((long)&pSVar10[lVar19].test.m_backend + 0x10);
      *(undefined8 *)puVar1 = uVar6;
      *(undefined8 *)(puVar1 + 2) = uVar7;
      *(undefined8 *)((long)&pSVar10[lVar19].test.m_backend + 0x20) =
           *(undefined8 *)((long)&pSVar10[(long)iVar8 + -1].test.m_backend + 0x20);
      *(int *)((long)&pSVar10[lVar19].test.m_backend + 0x28) =
           *(int *)((long)&pSVar10[(long)iVar8 + -1].test.m_backend + 0x28);
      *(bool *)((long)&pSVar10[lVar19].test.m_backend + 0x2c) =
           *(bool *)((long)&pSVar10[(long)iVar8 + -1].test.m_backend + 0x2c);
      *(undefined8 *)((long)&pSVar10[lVar19].test.m_backend + 0x30) =
           *(undefined8 *)((long)&pSVar10[(long)iVar8 + -1].test.m_backend + 0x30);
      pSVar10 = (this->pricSet).data.
                super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar18 = (ulong)(uint)this->used;
      uVar20 = (long)(this->pricSet).data.
                     super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar10;
    }
    iVar8 = this->multiParts;
    uVar14 = this->last;
    do {
      uVar14 = (int)(uVar14 + 1) % iVar8;
      this->last = uVar14;
      pSVar13 = (this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver;
      uVar15 = ~uVar14;
      iVar17 = (pSVar13->thevectors->set).thenum + uVar15;
      if (-1 < iVar17) {
        do {
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::computePvec(&local_a0,
                        (this->
                        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver,iVar17);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::computeTest(&local_a0,
                        (this->
                        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver,iVar17);
          local_e8.data._M_elems._32_5_ = local_a0.m_backend.data._M_elems._32_5_;
          local_e8.data._M_elems[9]._1_3_ = local_a0.m_backend.data._M_elems[9]._1_3_;
          local_e8.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
          local_e8.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
          local_e8.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
          local_e8.data._M_elems[7]._1_3_ = local_a0.m_backend.data._M_elems[7]._1_3_;
          local_e8.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
          local_e8.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
          local_e8.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
          local_e8.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
          local_e8.exp = local_a0.m_backend.exp;
          local_e8.neg = local_a0.m_backend.neg;
          local_e8.fpclass = local_a0.m_backend.fpclass;
          local_e8.prec_elem = local_a0.m_backend.prec_elem;
          if (((local_a0.m_backend.fpclass != cpp_dec_float_NaN) &&
              (local_68.fpclass != cpp_dec_float_NaN)) &&
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_e8,&local_68), iVar8 < 0)) {
            SVar12 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::id((this->
                          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesolver,iVar17);
            (this->pricSet).data.
            super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
            ._M_impl.super__Vector_impl_data._M_start[this->used].id.super_DataKey =
                 SVar12.super_DataKey;
            iVar8 = this->used;
            pSVar10 = (this->pricSet).data.
                      super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)((long)&pSVar10[iVar8].test.m_backend + 0x20) =
                 CONCAT35(local_e8.data._M_elems[9]._1_3_,local_e8.data._M_elems._32_5_);
            puVar1 = (uint *)((long)&pSVar10[iVar8].test.m_backend + 0x10);
            *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_);
            *(undefined8 *)&pSVar10[iVar8].test.m_backend = local_e8.data._M_elems._0_8_;
            *(undefined8 *)((long)&pSVar10[iVar8].test.m_backend + 8) = local_e8.data._M_elems._8_8_
            ;
            *(int *)((long)&pSVar10[iVar8].test.m_backend + 0x28) = local_e8.exp;
            *(bool *)((long)&pSVar10[iVar8].test.m_backend + 0x2c) = local_e8.neg;
            *(undefined8 *)((long)&pSVar10[iVar8].test.m_backend + 0x30) = local_e8._48_8_;
            this->used = this->used + 1;
          }
          iVar8 = this->multiParts;
          iVar17 = iVar17 - iVar8;
        } while (-1 < iVar17);
        pSVar13 = (this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver;
        uVar14 = this->last;
        uVar15 = ~uVar14;
      }
      uVar15 = uVar15 + (pSVar13->thecovectors->set).thenum;
      if (-1 < (int)uVar15) {
        do {
          pnVar3 = (((this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver)->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar4 = *(undefined8 *)((long)&pnVar3[uVar15].m_backend.data + 0x20);
          local_e8.data._M_elems._32_5_ = SUB85(uVar4,0);
          local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          local_e8.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[uVar15].m_backend.data;
          local_e8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[uVar15].m_backend.data + 8);
          puVar1 = (uint *)((long)&pnVar3[uVar15].m_backend.data + 0x10);
          local_e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          uVar4 = *(undefined8 *)(puVar1 + 2);
          local_e8.data._M_elems._24_5_ = SUB85(uVar4,0);
          local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          local_e8.exp = pnVar3[uVar15].m_backend.exp;
          local_e8.neg = pnVar3[uVar15].m_backend.neg;
          local_e8.fpclass = pnVar3[uVar15].m_backend.fpclass;
          local_e8.prec_elem = pnVar3[uVar15].m_backend.prec_elem;
          if (((local_e8.fpclass != cpp_dec_float_NaN) && (local_68.fpclass != cpp_dec_float_NaN))
             && (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_e8,&local_68), iVar8 < 0)) {
            SVar12 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::coId((this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver,uVar15);
            (this->pricSet).data.
            super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
            ._M_impl.super__Vector_impl_data._M_start[this->used].id.super_DataKey =
                 SVar12.super_DataKey;
            iVar8 = this->used;
            pSVar10 = (this->pricSet).data.
                      super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)((long)&pSVar10[iVar8].test.m_backend + 0x20) =
                 CONCAT35(local_e8.data._M_elems[9]._1_3_,local_e8.data._M_elems._32_5_);
            puVar1 = (uint *)((long)&pSVar10[iVar8].test.m_backend + 0x10);
            *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_);
            *(undefined8 *)&pSVar10[iVar8].test.m_backend = local_e8.data._M_elems._0_8_;
            *(undefined8 *)((long)&pSVar10[iVar8].test.m_backend + 8) = local_e8.data._M_elems._8_8_
            ;
            *(int *)((long)&pSVar10[iVar8].test.m_backend + 0x28) = local_e8.exp;
            *(bool *)((long)&pSVar10[iVar8].test.m_backend + 0x2c) = local_e8.neg;
            *(undefined8 *)((long)&pSVar10[iVar8].test.m_backend + 0x30) = local_e8._48_8_;
            this->used = this->used + 1;
          }
          iVar8 = this->multiParts;
          uVar15 = uVar15 - iVar8;
        } while (-1 < (int)uVar15);
        uVar14 = this->last;
      }
      iVar17 = this->used;
    } while ((iVar17 < this->min) && (uVar14 != local_a4));
    if (iVar17 < 1) {
      DVar11.info = 0;
      DVar11.idx = 0;
      uVar20 = 0xffffffff;
    }
    else {
      iVar8 = this->partialSize;
      if (iVar17 + 1 < this->partialSize) {
        iVar8 = iVar17 + 1;
      }
      this->min = iVar8;
      uVar18 = 0;
      if (iVar17 != 1) {
        lVar16 = 1;
        lVar19 = 0x48;
        do {
          pSVar10 = (this->pricSet).data.
                    super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(int *)((long)&(pSVar10->test).m_backend + lVar19 + 0x28U) != 2) {
            uVar14 = (uint)uVar18;
            if (*(fpclass_type *)((long)&pSVar10[(int)uVar14].test.m_backend + 0x30) !=
                cpp_dec_float_NaN) {
              iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)&(pSVar10->test).m_backend + lVar19 + -8),
                                 &pSVar10[(int)uVar14].test.m_backend);
              uVar15 = (uint)lVar16;
              if (-1 < iVar8) {
                uVar15 = uVar14;
              }
              iVar17 = this->used;
              uVar18 = (ulong)uVar15;
            }
          }
          lVar16 = lVar16 + 1;
          lVar19 = lVar19 + 0x40;
        } while (lVar16 < iVar17);
        uVar18 = (ulong)(int)uVar18;
      }
      DVar11 = (this->pricSet).data.
               super__Vector_base<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18].id.super_DataKey;
      uVar20 = (ulong)DVar11 >> 0x20;
    }
  }
  else {
    uVar4 = *(undefined8 *)
             ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thetolerance.m_backend.data._M_elems + 8);
    local_128.data._M_elems._32_5_ = SUB85(uVar4,0);
    local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_128.data._M_elems._0_8_ =
         *(undefined8 *)
          (this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.data._M_elems;
    local_128.data._M_elems._8_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 2);
    local_128.data._M_elems._16_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 4);
    uVar4 = *(undefined8 *)
             ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thetolerance.m_backend.data._M_elems + 6);
    local_128.data._M_elems._24_5_ = SUB85(uVar4,0);
    local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_128.exp =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.exp;
    local_128.neg =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.neg;
    local_128.fpclass =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.fpclass;
    local_128.prec_elem =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.prec_elem;
    if (local_128.fpclass != cpp_dec_float_finite || local_128.data._M_elems[0] != 0) {
      local_128.neg = (bool)(local_128.neg ^ 1);
    }
    uVar18 = (ulong)(pSVar13->thecovectors->set).thenum;
    if ((long)uVar18 < 1) {
      DVar11.info = 0;
      DVar11.idx = 0;
      uVar20 = 0xffffffff;
    }
    else {
      lVar19 = uVar18 * 0x38 + -8;
      uVar20 = 0xffffffff;
      DVar11.info = 0;
      DVar11.idx = 0;
      do {
        pnVar3 = (((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar19 + -0x10);
        local_e8.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar19 + -0x30);
        local_e8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_e8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar19 + -0x20);
        local_e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_e8.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_e8.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar19 + -8);
        local_e8.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar19 + -4);
        local_e8._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar19);
        if (((local_e8.fpclass != cpp_dec_float_NaN) && (local_128.fpclass != cpp_dec_float_NaN)) &&
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_e8,&local_128), iVar8 < 0)) {
          DVar11 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::coId((this->
                                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).thesolver,(int)uVar18 + -1);
          uVar20 = (ulong)DVar11 >> 0x20;
          pnVar3 = (((this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver)->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar4 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar19 + -0x10);
          local_128.data._M_elems._32_5_ = SUB85(uVar4,0);
          local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar19 + -0x30);
          local_128.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_128.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar19 + -0x20);
          local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          uVar4 = *(undefined8 *)(puVar1 + 2);
          local_128.data._M_elems._24_5_ = SUB85(uVar4,0);
          local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          local_128.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar19 + -8);
          local_128.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar19 + -4);
          local_128._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar19);
        }
        lVar19 = lVar19 + -0x38;
        bVar5 = 1 < uVar18;
        uVar18 = uVar18 - 1;
      } while (bVar5);
      pSVar13 = (this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver;
    }
    uVar18 = (ulong)(pSVar13->thevectors->set).thenum;
    if (0 < (long)uVar18) {
      lVar19 = uVar18 * 0x38 + -8;
      do {
        pnVar3 = (((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->theTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar19 + -0x10);
        local_e8.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar19 + -0x30);
        local_e8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_e8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar19 + -0x20);
        local_e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_e8.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_e8.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar19 + -8);
        local_e8.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar19 + -4);
        local_e8._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar19);
        if (((local_e8.fpclass != cpp_dec_float_NaN) && (local_128.fpclass != cpp_dec_float_NaN)) &&
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_e8,&local_128), iVar8 < 0)) {
          DVar11 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::id((this->
                                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thesolver,(int)uVar18 + -1);
          uVar20 = (ulong)DVar11 >> 0x20;
          pnVar3 = (((this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver)->theTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar4 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar19 + -0x10);
          local_128.data._M_elems._32_5_ = SUB85(uVar4,0);
          local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar19 + -0x30);
          local_128.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_128.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar19 + -0x20);
          local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          uVar4 = *(undefined8 *)(puVar1 + 2);
          local_128.data._M_elems._24_5_ = SUB85(uVar4,0);
          local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          local_128.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar19 + -8);
          local_128.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar19 + -4);
          local_128._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar19);
        }
        lVar19 = lVar19 + -0x38;
        bVar5 = 1 < uVar18;
        uVar18 = uVar18 - 1;
      } while (bVar5);
    }
  }
  return (SPxId)((ulong)DVar11 & 0xffffffff | uVar20 << 0x20);
}

Assistant:

SPxId SPxParMultPR<R>::selectEnter()
{
   SPxId id;
   R x;
   int i;
   int best = -1;
   //    const SPxBasisBase<R>::Desc& ds   = this->thesolver->basis().desc();

   assert(this->thesolver != nullptr);
   int lastlast = -1;

   if(this->thesolver->pricing() == SPxSolverBase<R>::PARTIAL)
   {
      R val;
      R tol = -this->thetolerance;
      lastlast = last;

      for(i = used - 1; i >= 0; --i)
      {
         int n = this->thesolver->number(pricSet[i].id);

         if(this->thesolver->isId(pricSet[i].id))
         {
            this->thesolver->computePvec(n);
            pricSet[i].test = val = this->thesolver->computeTest(n);
         }
         else
            pricSet[i].test = val = this->thesolver->coTest()[n];

         if(val >= tol)
            pricSet[i] = pricSet[--used];
      }

      while(pricSet.size() - used < partialSize)
      {
         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test > pricSet[best].test)
               best = i;
         }

         pricSet[best] = pricSet[--used];
      }

      do
      {
         last = (last + 1) % multiParts;

         for(i = this->thesolver->coDim() - last - 1;
               i >= 0; i -= multiParts)
         {
            this->thesolver->computePvec(i);
            x = this->thesolver->computeTest(i);

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->id(i);
               pricSet[used].test = x;
               used++;
            }
         }

         for(i = this->thesolver->dim() - last - 1;
               i >= 0; i -= multiParts)
         {
            x = this->thesolver->coTest()[i];

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->coId(i);
               pricSet[used].test = x;
               used++;
            }
         }

         assert(used < pricSet.size());
      }
      while(used < min && last != lastlast);

      if(used > 0)
      {
         min = (used + 1);

         if(min < 1)
            min = 1;

         if(min > partialSize)
            min = partialSize;

         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test < pricSet[best].test)
               best = i;
         }

         id = pricSet[best].id;
      }

      return id;
   }

   else
   {
      assert(this->thesolver->pricing() == SPxSolverBase<R>::FULL);
      R bestx = -this->thetolerance;

      for(i = this->thesolver->dim() - 1; i >= 0; --i)
      {
         x = this->thesolver->coTest()[i];

         // x *= EQ_PREF * (1 + (ds.coStatus(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.coStatus(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->coId(i);
            bestx = this->thesolver->coTest()[i];
         }
      }

      for(i = this->thesolver->coDim() - 1; i >= 0; --i)
      {
         x = this->thesolver->test()[i];

         // x *= EQ_PREF * (1 + (ds.status(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.status(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->id(i);
            bestx = this->thesolver->test()[i];
         }
      }

      return id;
   }
}